

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void expandFormatArguments<Token,Token>
               (vector<String,_std::allocator<String>_> *data,Token *arg,Token *rest)

{
  String *__x;
  FormatArgument local_40;
  Token *local_20;
  Token *rest_local;
  Token *arg_local;
  vector<String,_std::allocator<String>_> *data_local;
  
  local_20 = rest;
  rest_local = arg;
  arg_local = (Token *)data;
  FormatArgument::FormatArgument<Token>(&local_40,arg);
  __x = FormatArgument::text(&local_40);
  std::vector<String,_std::allocator<String>_>::push_back(data,__x);
  FormatArgument::~FormatArgument(&local_40);
  expandFormatArguments<Token>((vector<String,_std::allocator<String>_> *)arg_local,local_20);
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}